

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariantSet
          (AsciiParser *this,int64_t primIdx,int64_t parentPrimIdx,uint32_t depth,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          *variantSetOut)

{
  ulong uVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Specifier s;
  ulong uVar8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX_01;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames;
  long lVar9;
  char *pcVar10;
  tinyusdz *this_00;
  string variantName;
  char mc;
  int64_t idx;
  PrimMetaMap metas;
  VariantContent variantContent;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  variantContentMap;
  ostringstream ss_e;
  uint8_t local_3a3;
  uint8_t local_3a1;
  string local_3a0;
  string local_380;
  uint32_t local_35c;
  Identifier local_358;
  long local_338;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  *local_330;
  AsciiParser *local_328;
  _Any_data *local_320;
  int64_t local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
  local_308;
  undefined1 local_2d8 [32];
  _Base_ptr local_2b8;
  size_t local_2b0;
  pointer plStack_2a8;
  iterator local_2a0;
  long *plStack_298;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  local_290;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> vStack_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
  local_248;
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  local_1d8;
  int64_t local_1a8 [14];
  ios_base local_138 [264];
  
  if (variantSetOut ==
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
       *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[ASCII]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ParseVariantSet",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x120d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"[InternalError] variantSetOut arg is nullptr.",0x2d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_2d8);
    if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
  }
  else {
    bVar4 = Expect(this,'{');
    if (bVar4) {
      local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)primIdx;
      bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar4) {
        return false;
      }
      local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1d8._M_impl.super__Rb_tree_header._M_header;
      local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_320 = (_Any_data *)&this->_prim_idx_assign_fun;
      local_35c = depth + 1;
      local_330 = variantSetOut;
      local_328 = this;
      local_318 = parentPrimIdx;
      local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pSVar2 = this->_sr;
        uVar8 = pSVar2->length_;
        uVar3 = pSVar2->idx_;
        if ((uVar8 <= uVar3) || (pSVar2->binary_[uVar3] == '\0')) {
LAB_003fcf37:
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          ::operator=(local_330,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                       *)&local_1d8);
          bVar4 = true;
          goto LAB_003fd1eb;
        }
        uVar1 = uVar3 + 1;
        if (uVar1 <= uVar8) {
          local_3a3 = pSVar2->binary_[uVar3];
          pSVar2->idx_ = uVar1;
        }
        iVar7 = 1;
        if ((uVar1 <= uVar8) && (iVar7 = 5, local_3a3 != '}')) {
          iVar7 = 0;
          uVar8 = pSVar2->idx_ - 1;
          if ((-1 < (long)uVar8) && (uVar8 <= pSVar2->length_)) {
            pSVar2->idx_ = uVar8;
          }
        }
        if (iVar7 != 0) {
          if (iVar7 == 5) goto LAB_003fcf37;
          goto LAB_003fd1e8;
        }
        bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar4) goto LAB_003fd1e8;
        local_380._M_string_length = 0;
        local_380.field_2._M_local_buf[0] = '\0';
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        bVar4 = ReadBasicType(this,&local_380);
        if (!bVar4) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[ASCII]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseVariantSet",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1238);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Failed to parse variant name for `variantSet` statement."
                     ,0x38);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_2d8);
          if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
LAB_003fd1d1:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,
                            CONCAT71(local_380.field_2._M_allocated_capacity._1_7_,
                                     local_380.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_003fd1e8;
        }
        bVar4 = SkipWhitespace(this);
        if (!bVar4) goto LAB_003fd1d1;
        local_308._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_308._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_308._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_308._M_impl.super__Rb_tree_header._M_header;
        local_308._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_308._M_impl.super__Rb_tree_header._M_header._M_right =
             local_308._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar4 = LookChar1(this,(char *)&local_358);
        if (!bVar4) {
LAB_003fd1c0:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
          ::_M_erase(&local_308,
                     (_Link_type)local_308._M_impl.super__Rb_tree_header._M_header._M_parent);
          goto LAB_003fd1d1;
        }
        if (((char)local_358.super_string._M_dataplus._M_p == '(') &&
           (bVar4 = ParsePrimMetas(this,(PrimMetaMap *)&local_308), !bVar4)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[ASCII]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseVariantSet",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x124a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Failed to parse PrimSpec metas in variant statement.",
                     0x34);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_2d8);
          if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          goto LAB_003fd1c0;
        }
        bVar4 = Expect(this,'{');
        if ((!bVar4) || (bVar4 = SkipCommentAndWhitespaceAndNewline(this,true), !bVar4))
        goto LAB_003fd1c0;
        local_2d8._8_4_ = _S_red;
        local_2d8._16_8_ = (_Link_type)0x0;
        local_2d8._24_8_ = local_2d8 + 8;
        local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_2a0._M_current = (long *)0x0;
        plStack_298 = (long *)0x0;
        local_2b0 = 0;
        plStack_2a8 = (pointer)0x0;
        local_290._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_290._M_impl.super__Rb_tree_header._M_header;
        local_248._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        vStack_260.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_260.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
        vStack_260.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_248._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_248._M_impl.super__Rb_tree_header._M_header;
        local_248._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_2b8 = (_Base_ptr)local_2d8._24_8_;
        local_290._M_impl.super__Rb_tree_header._M_header._M_right =
             local_290._M_impl.super__Rb_tree_header._M_header._M_left;
        local_248._M_impl.super__Rb_tree_header._M_header._M_right =
             local_248._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_003fc635:
        pSVar2 = this->_sr;
        uVar8 = pSVar2->length_;
        uVar3 = pSVar2->idx_;
        if ((uVar8 <= uVar3) || (pSVar2->binary_[uVar3] == '\0')) {
LAB_003fca58:
          bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (bVar4) {
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
            ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                         *)local_2d8,&local_308);
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>
            ::_M_emplace_unique<std::__cxx11::string&,tinyusdz::ascii::AsciiParser::VariantContent&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>
                        *)&local_1d8,&local_380,(VariantContent *)local_2d8);
            bVar4 = true;
          }
          else {
LAB_003fcd31:
            bVar4 = false;
          }
          goto LAB_003fcd33;
        }
        uVar1 = uVar3 + 1;
        if (uVar1 <= uVar8) {
          local_3a1 = pSVar2->binary_[uVar3];
          pSVar2->idx_ = uVar1;
        }
        iVar7 = 0;
        if (local_3a1 == '}') {
          iVar7 = 0xb;
        }
        if (uVar8 < uVar1) {
          iVar7 = 1;
        }
        if (iVar7 == 0) {
          uVar8 = pSVar2->idx_ - 1;
          iVar7 = 1;
          if (((long)uVar8 < 0) || (pSVar2->length_ < uVar8)) goto LAB_003fcaa2;
          pSVar2->idx_ = uVar8;
          local_358.super_string._M_dataplus._M_p = (pointer)&local_358.super_string.field_2;
          local_358.super_string._M_string_length = 0;
          local_358.super_string.field_2._M_local_buf[0] = '\0';
          bVar4 = ReadBasicType(this,&local_358);
          if (!bVar4) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseVariantSet",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x126f);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            lVar9 = 0x3c;
            pcVar10 = "Failed to parse an identifier in variantSet block statement.";
LAB_003fcca4:
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar9)
            ;
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            PushError(this,(string *)&local_3a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
LAB_003fcd15:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358.super_string._M_dataplus._M_p != &local_358.super_string.field_2) {
              operator_delete(local_358.super_string._M_dataplus._M_p,
                              CONCAT71(local_358.super_string.field_2._M_allocated_capacity._1_7_,
                                       local_358.super_string.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_003fcd31;
          }
          pSVar2 = this->_sr;
          uVar8 = pSVar2->idx_ - local_358.super_string._M_string_length;
          if (((long)uVar8 < 0) || (pSVar2->length_ < uVar8)) goto LAB_003fcd15;
          pSVar2->idx_ = uVar8;
          iVar5 = ::std::__cxx11::string::compare((char *)&local_358);
          if (iVar5 == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseVariantSet",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1277);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            lVar9 = 0x29;
            pcVar10 = "Nested `variantSet` is not supported yet.";
            goto LAB_003fcca4;
          }
          iVar5 = ::std::__cxx11::string::compare((char *)&local_358);
          if (iVar5 == 0) {
            bVar4 = false;
            this_00 = (tinyusdz *)0x0;
            propNames = extraout_RDX;
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)&local_358);
            if (iVar5 == 0) {
              this_00 = (tinyusdz *)0x1;
              bVar4 = false;
              propNames = extraout_RDX_00;
            }
            else {
              iVar5 = ::std::__cxx11::string::compare((char *)&local_358);
              bVar4 = iVar5 != 0;
              this_00 = (tinyusdz *)(ulong)(bVar4 | 2);
              propNames = extraout_RDX_01;
            }
          }
          if (bVar4) {
            bVar4 = ParsePrimProps(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                         *)&local_290,propNames);
            if (!bVar4) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseVariantSet",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x129b);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              lVar9 = 0x1f;
              pcVar10 = "Failed to parse Prim attribute.";
              goto LAB_003fcca4;
            }
          }
          else {
            local_1a8[0] = local_318;
            if ((this->_prim_idx_assign_fun).super__Function_base._M_manager == (_Manager_type)0x0)
            {
              ::std::__throw_bad_function_call();
            }
            local_338 = (*(this->_prim_idx_assign_fun)._M_invoker)(local_320,(long *)local_1a8);
            args = local_310;
            bVar4 = ParseBlock(this,(Specifier)this_00,local_338,(int64_t)local_310,local_35c,false)
            ;
            if (bVar4) {
              if (local_2a0._M_current == plStack_298) {
                ::std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          ((vector<long,std::allocator<long>> *)&plStack_2a8,local_2a0,&local_338);
              }
              else {
                *local_2a0._M_current = local_338;
                local_2a0._M_current = local_2a0._M_current + 1;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseVariantSet",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1290);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_218[0] = local_208;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_218,"`{}` block parse failed.","");
              tinyusdz::to_string_abi_cxx11_(&local_1f8,this_00,s);
              fmt::format<std::__cxx11::string>
                        (&local_3a0,(fmt *)local_218,(string *)&local_1f8,args);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_3a0._M_dataplus._M_p,
                                  local_3a0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p,
                                local_3a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              this = local_328;
              if (local_218[0] != local_208) {
                operator_delete(local_218[0],local_208[0] + 1);
              }
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)&local_3a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p,
                                local_3a0.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
            }
            if (!bVar4) goto LAB_003fcd15;
          }
          bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358.super_string._M_dataplus._M_p != &local_358.super_string.field_2) {
            operator_delete(local_358.super_string._M_dataplus._M_p,
                            CONCAT71(local_358.super_string.field_2._M_allocated_capacity._1_7_,
                                     local_358.super_string.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar4) goto LAB_003fcaa2;
          goto LAB_003fc635;
        }
        if (iVar7 == 0xb) goto LAB_003fca58;
LAB_003fcaa2:
        bVar4 = iVar7 == 0;
LAB_003fcd33:
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
        ::_M_erase(&local_248,
                   (_Link_type)local_248._M_impl.super__Rb_tree_header._M_header._M_parent);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&vStack_260);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
        ::_M_erase(&local_290,
                   (_Link_type)local_290._M_impl.super__Rb_tree_header._M_header._M_parent);
        if (plStack_2a8 != (pointer)0x0) {
          operator_delete(plStack_2a8,(long)plStack_298 - (long)plStack_2a8);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                    *)local_2d8,(_Link_type)local_2d8._16_8_);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
        ::_M_erase(&local_308,
                   (_Link_type)local_308._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,
                          CONCAT71(local_380.field_2._M_allocated_capacity._1_7_,
                                   local_380.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar4) {
LAB_003fd1e8:
          bVar4 = false;
LAB_003fd1eb:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          ::_M_erase(&local_1d8,
                     (_Link_type)local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent);
          return bVar4;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseVariantSet(
    const int64_t primIdx, const int64_t parentPrimIdx, const uint32_t depth,
    std::map<std::string, VariantContent> *variantSetOut) {
  if (!variantSetOut) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii,
                              "[InternalError] variantSetOut arg is nullptr.");
  }

  // variantSet =
  // {
  //   "variantName0" ( metas ) { ... }
  //   "variantName1" ( metas ) { ... }
  //   ...
  // }
  if (!Expect('{')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, VariantContent> variantContentMap;

  // for each variantStatement
  while (!Eof()) {
    {
      char c;
      if (!Char1(&c)) {
        return false;
      }

      if (c == '}') {
        // end
        break;
      }

      Rewind(1);
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // string
    std::string variantName;
    if (!ReadBasicType(&variantName)) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Failed to parse variant name for `variantSet` statement.");
    }

    if (!SkipWhitespace()) {
      return false;
    }

    // Optional: PrimSpec meta
    PrimMetaMap metas;
    {
      char mc;
      if (!LookChar1(&mc)) {
        return false;
      }

      if (mc == '(') {
        if (!ParsePrimMetas(&metas)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii, "Failed to parse PrimSpec metas in variant statement.");
        }
      }
    }

    if (!Expect('{')) {
      return false;
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    VariantContent variantContent;

    while (!Eof()) {
      {
        char c;
        if (!Char1(&c)) {
          return false;
        }

        if (c == '}') {
          DCOUT("End block in variantSet stmt.");
          // end block
          break;
        }
      }

      if (!Rewind(1)) {
        return false;
      }

      DCOUT("Read first token in VariantSet stmt");
      Identifier tok;
      if (!ReadBasicType(&tok)) {
        PUSH_ERROR_AND_RETURN(
            "Failed to parse an identifier in variantSet block statement.");
      }

      if (!Rewind(tok.size())) {
        return false;
      }

      if (tok == "variantSet") {
        PUSH_ERROR_AND_RETURN("Nested `variantSet` is not supported yet.");
      }

      Specifier child_spec{Specifier::Invalid};
      if (tok == "def") {
        child_spec = Specifier::Def;
      } else if (tok == "over") {
        child_spec = Specifier::Over;
      } else if (tok == "class") {
        child_spec = Specifier::Class;
      }

      // No specifier => Assume properties only.
      // Has specifier => Prim
      if (child_spec != Specifier::Invalid) {
        // FIXME: Assign idx dedicated for variant.
        int64_t idx = _prim_idx_assign_fun(parentPrimIdx);
        DCOUT("enter parseBlock in variantSet. spec = "
              << to_string(child_spec) << ", idx = " << idx
              << ", rootIdx = " << primIdx);

        // recusive call
        if (!ParseBlock(child_spec, idx, primIdx, depth + 1,
                        /* in_variantStmt */ true)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("`{}` block parse failed.", to_string(child_spec)));
        }
        DCOUT(fmt::format("Done parse `{}` block.", to_string(child_spec)));

        DCOUT(fmt::format("Add primIdx {} to variant {}", idx, variantName));
        variantContent.primIndices.push_back(idx);

      } else {
        DCOUT("Enter ParsePrimProps.");
        if (!ParsePrimProps(&variantContent.props,
                            &variantContent.properties)) {
          PUSH_ERROR_AND_RETURN("Failed to parse Prim attribute.");
        }
        DCOUT(fmt::format("Done parse ParsePrimProps."));
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    DCOUT(fmt::format("variantSet item {} parsed.", variantName));

    variantContent.metas = metas;
    variantContentMap.emplace(variantName, variantContent);
  }

  (*variantSetOut) = std::move(variantContentMap);

  return true;
}